

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 size)

{
  bool bVar1;
  ImVec2 p_max;
  ImVec2 p_max_00;
  bool bVar2;
  byte bVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  float in_EDX;
  ImVec2 in_RSI;
  undefined8 in_RDI;
  ImVec2 *min;
  undefined8 in_XMM0_Qa;
  ImVec4 col_source;
  float mid_x;
  float off;
  ImRect bb_inner;
  float rounding;
  float grid_step;
  ImVec4 col_rgb_without_alpha;
  ImVec4 col_rgb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  float default_size;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  ImRect *in_stack_fffffffffffffe70;
  ImDrawCornerFlags rounding_corners;
  float offset_from_start_x;
  undefined8 in_stack_fffffffffffffe78;
  ImGuiCond cond;
  float in_stack_fffffffffffffe80;
  ImGuiCol in_stack_fffffffffffffe84;
  ImDrawList *in_stack_fffffffffffffe88;
  ImGuiWindow *in_stack_fffffffffffffe90;
  ImRect *in_stack_fffffffffffffe98;
  ImGuiDragDropFlags flags_00;
  float *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  bool *in_stack_fffffffffffffeb0;
  bool *in_stack_fffffffffffffeb8;
  ImDrawList *pIVar7;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  ImVec2 in_stack_fffffffffffffec8;
  ImVec2 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImVec2 in_stack_fffffffffffffee0;
  ImRect *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float rounding_corners_00;
  ImVec2 in_stack_ffffffffffffff00;
  ImVec2 *in_stack_ffffffffffffff08;
  ImDrawList *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  ImVec2 in_stack_ffffffffffffff20;
  float fStack_c4;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a4;
  float local_9c;
  float local_98;
  ImRect local_94;
  float local_84;
  float local_80;
  ImVec4 local_7c;
  float _x;
  float _y;
  float _z;
  float fVar8;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  ImVec2 local_58;
  undefined1 local_50 [16];
  float local_40;
  float local_3c;
  ImVec2 local_38;
  float in_stack_ffffffffffffffd8;
  float local_18;
  float fVar9;
  float in_stack_fffffffffffffff0;
  float local_c;
  float fStack_8;
  bool local_1;
  
  fVar5 = (float)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_18 = (float)in_RDI;
  fVar9 = (float)((ulong)in_RDI >> 0x20);
  IVar6 = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)IVar6 + 0x83) & 1U) == 0) {
    local_38 = (ImVec2)GImGui;
    local_3c = (float)ImGuiWindow::GetID(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88
                                         ,(char *)CONCAT44(in_stack_fffffffffffffe84,
                                                           in_stack_fffffffffffffe80));
    local_40 = GetFrameHeight();
    local_c = (float)in_XMM0_Qa;
    bVar2 = NAN(local_c);
    bVar1 = local_c == 0.0;
    _local_c = in_XMM0_Qa;
    if ((bVar1) && (!bVar2)) {
      fStack_8 = SUB84(in_XMM0_Qa,4);
      local_c = local_40;
    }
    if ((fStack_8 == 0.0) && (!NAN(fStack_8))) {
      fStack_8 = local_40;
    }
    min = (ImVec2 *)((long)IVar6 + 0xd0);
    local_58 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                           (ImVec2 *)0x245a50);
    ImRect::ImRect((ImRect *)local_50,min,&local_58);
    if (fStack_8 < local_40) {
      rounding_corners_00 = 0.0;
    }
    else {
      rounding_corners_00 = *(float *)((long)local_38 + 0x15a4);
    }
    ItemSize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    rounding_corners = (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    bVar2 = ItemAdd(in_stack_fffffffffffffe98,(ImGuiID)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe88);
    if (bVar2) {
      bVar3 = ButtonBehavior((ImRect *)in_stack_fffffffffffffec8,(ImGuiID)in_stack_fffffffffffffec4,
                             in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             (ImGuiButtonFlags)fVar5);
      if (((uint)in_EDX & 2) != 0) {
        in_EDX = (float)((uint)in_EDX & 0xfff9ffff);
      }
      _x = (float)*(undefined8 *)in_RSI;
      _y = (float)((ulong)*(undefined8 *)in_RSI >> 0x20);
      _z = (float)*(undefined8 *)((long)in_RSI + 8);
      fVar8 = (float)((ulong)*(undefined8 *)((long)in_RSI + 8) >> 0x20);
      if (((uint)in_EDX & 0x10000000) != 0) {
        ColorConvertHSVtoRGB
                  ((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),fVar5,in_stack_fffffffffffffea0,
                   (float *)in_stack_fffffffffffffe98,(float *)in_stack_fffffffffffffe90);
      }
      flags_00 = (ImGuiDragDropFlags)in_stack_fffffffffffffea0;
      ImVec4::ImVec4(&local_7c,_x,_y,_z,1.0);
      local_80 = ImMin<float>(local_c,fStack_8);
      local_80 = local_80 / 2.99;
      local_84 = ImMin<float>(*(float *)((long)local_38 + 0x15a8),local_80 * 0.5);
      local_94.Min.x = (float)local_50._0_4_;
      local_94.Min.y = (float)local_50._4_4_;
      local_94.Max.x = (float)local_50._8_4_;
      local_94.Max.y = (float)local_50._12_4_;
      local_98 = 0.0;
      if (((uint)in_EDX & 0x400) == 0) {
        local_98 = -0.75;
        ImRect::Expand(&local_94,-0.75);
      }
      if ((((uint)in_EDX & 0x40000) == 0) || (1.0 <= fVar8)) {
        if (((uint)in_EDX & 0x20000) == 0) {
          in_stack_fffffffffffffec8 = (ImVec2)&local_7c;
        }
        else {
          in_stack_fffffffffffffec8 = (ImVec2)&stack0xffffffffffffff94;
        }
        fStack_c4 = (float)((ulong)*(ImDrawCmd **)((long)in_stack_fffffffffffffec8 + 8) >> 0x20);
        if (1.0 <= fStack_c4) {
          flags_00 = (ImGuiDragDropFlags)*(ImDrawList **)((long)IVar6 + 0x2b0);
          GetColorU32((ImVec4 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          fVar5 = in_stack_fffffffffffffee0.y;
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_fffffffffffffe90,(ImVec2 *)in_stack_fffffffffffffe88,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (float)in_stack_fffffffffffffe78,rounding_corners);
          cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        }
        else {
          pIVar7 = *(ImDrawList **)((long)IVar6 + 0x2b0);
          in_stack_ffffffffffffff20 = local_94.Max;
          fVar5 = (float)GetColorU32((ImVec4 *)
                                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe78 >> 0x20);
          in_stack_fffffffffffffec4 = local_80;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff18,local_98,local_98);
          p_max_00.y = in_stack_fffffffffffffedc;
          p_max_00.x = in_stack_fffffffffffffed8;
          RenderColorRectWithAlphaCheckerboard
                    ((ImDrawList *)in_stack_fffffffffffffec8,in_stack_fffffffffffffee0,p_max_00,
                     (ImU32)in_stack_fffffffffffffec4,fVar5,in_stack_fffffffffffffed0,
                     (float)((ulong)pIVar7 >> 0x20),(int)pIVar7);
          fVar5 = in_stack_fffffffffffffee0.y;
        }
      }
      else {
        local_9c = (float)(int)((local_94.Min.x + local_94.Max.x) * 0.5 + 0.5);
        in_stack_fffffffffffffed0 = *(ImVec2 *)((long)IVar6 + 0x2b0);
        ImVec2::ImVec2(&local_a4,local_94.Min.x + local_80,local_94.Min.y);
        local_b0 = local_94.Max;
        fVar4 = (float)GetColorU32((ImVec4 *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        fVar5 = local_80;
        ImVec2::ImVec2(&local_b8,local_98 - local_80,local_98);
        p_max.y = fVar5;
        p_max.x = fVar4;
        RenderColorRectWithAlphaCheckerboard
                  ((ImDrawList *)in_stack_fffffffffffffec8,in_stack_fffffffffffffee0,p_max,
                   (ImU32)in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffed0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (int)in_stack_fffffffffffffeb8);
        fVar5 = (float)((ulong)*(ImDrawList **)((long)IVar6 + 0x2b0) >> 0x20);
        in_stack_fffffffffffffee8 = &local_94;
        ImVec2::ImVec2(&local_c0,local_9c,local_94.Max.y);
        GetColorU32((ImVec4 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe90,(ImVec2 *)in_stack_fffffffffffffe88,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (float)in_stack_fffffffffffffe78,rounding_corners);
        cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      }
      RenderNavHighlight((ImRect *)in_stack_ffffffffffffff20,(ImGuiID)in_stack_ffffffffffffff1c,
                         (ImGuiNavHighlightFlags)in_stack_ffffffffffffff18);
      if (((uint)in_EDX & 0x400) == 0) {
        if (*(float *)((long)local_38 + 0x15ac) <= 0.0) {
          in_stack_fffffffffffffe88 = *(ImDrawList **)((long)IVar6 + 0x2b0);
          in_stack_fffffffffffffe90 = (ImGuiWindow *)local_50;
          GetColorU32(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
          ImDrawList::AddRect(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              (ImVec2 *)in_stack_ffffffffffffff00,(ImU32)((ulong)min >> 0x20),
                              SUB84(min,0),(ImDrawCornerFlags)rounding_corners_00,
                              in_stack_fffffffffffffef0);
        }
        else {
          RenderFrameBorder(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                            in_stack_fffffffffffffec4);
        }
      }
      fVar4 = IVar6.y;
      if (((*(float *)((long)local_38 + 0x1ac8) == local_3c) && (((uint)in_EDX & 0x200) == 0)) &&
         (bVar2 = BeginDragDropSource(flags_00), bVar2)) {
        if (((uint)in_EDX & 2) == 0) {
          SetDragDropPayload((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),cond);
        }
        else {
          SetDragDropPayload((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),cond);
        }
        offset_from_start_x = fVar9;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff00,0.0,0.0);
        IVar6.y = in_stack_fffffffffffffff0;
        IVar6.x = fVar9;
        ColorButton((char *)in_RSI,(ImVec4 *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),
                    (ImGuiColorEditFlags)fVar4,IVar6);
        SameLine(offset_from_start_x,local_18);
        TextEx((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,
                                         CONCAT15(bVar3,CONCAT14(in_stack_ffffffffffffffa4,fVar8))))
               ,(char *)CONCAT44(_z,_y),(ImGuiTextFlags)_x);
        EndDragDropSource();
      }
      if ((((uint)in_EDX & 0x40) == 0) && ((in_stack_ffffffffffffffa7 & 1) != 0)) {
        ColorTooltip((char *)CONCAT44(rounding_corners_00,in_stack_fffffffffffffef0),
                     (float *)in_stack_fffffffffffffee8,(ImGuiColorEditFlags)fVar5);
      }
      local_1 = (bool)(bVar3 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ColorButton(const char* desc_id, const ImVec4& col, ImGuiColorEditFlags flags, ImVec2 size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(desc_id);
    float default_size = GetFrameHeight();
    if (size.x == 0.0f)
        size.x = default_size;
    if (size.y == 0.0f)
        size.y = default_size;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    if (flags & ImGuiColorEditFlags_NoAlpha)
        flags &= ~(ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf);

    ImVec4 col_rgb = col;
    if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(col_rgb.x, col_rgb.y, col_rgb.z, col_rgb.x, col_rgb.y, col_rgb.z);

    ImVec4 col_rgb_without_alpha(col_rgb.x, col_rgb.y, col_rgb.z, 1.0f);
    float grid_step = ImMin(size.x, size.y) / 2.99f;
    float rounding = ImMin(g.Style.FrameRounding, grid_step * 0.5f);
    ImRect bb_inner = bb;
    float off = 0.0f;
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        off = -0.75f; // The border (using Col_FrameBg) tends to look off when color is near-opaque and rounding is enabled. This offset seemed like a good middle ground to reduce those artifacts.
        bb_inner.Expand(off);
    }
    if ((flags & ImGuiColorEditFlags_AlphaPreviewHalf) && col_rgb.w < 1.0f)
    {
        float mid_x = IM_ROUND((bb_inner.Min.x + bb_inner.Max.x) * 0.5f);
        RenderColorRectWithAlphaCheckerboard(window->DrawList, ImVec2(bb_inner.Min.x + grid_step, bb_inner.Min.y), bb_inner.Max, GetColorU32(col_rgb), grid_step, ImVec2(-grid_step + off, off), rounding, ImDrawCornerFlags_TopRight| ImDrawCornerFlags_BotRight);
        window->DrawList->AddRectFilled(bb_inner.Min, ImVec2(mid_x, bb_inner.Max.y), GetColorU32(col_rgb_without_alpha), rounding, ImDrawCornerFlags_TopLeft|ImDrawCornerFlags_BotLeft);
    }
    else
    {
        // Because GetColorU32() multiplies by the global style Alpha and we don't want to display a checkerboard if the source code had no alpha
        ImVec4 col_source = (flags & ImGuiColorEditFlags_AlphaPreview) ? col_rgb : col_rgb_without_alpha;
        if (col_source.w < 1.0f)
            RenderColorRectWithAlphaCheckerboard(window->DrawList, bb_inner.Min, bb_inner.Max, GetColorU32(col_source), grid_step, ImVec2(off, off), rounding);
        else
            window->DrawList->AddRectFilled(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), rounding, ImDrawCornerFlags_All);
    }
    RenderNavHighlight(bb, id);
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        if (g.Style.FrameBorderSize > 0.0f)
            RenderFrameBorder(bb.Min, bb.Max, rounding);
        else
            window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), rounding); // Color button are often in need of some sort of border
    }

    // Drag and Drop Source
    // NB: The ActiveId test is merely an optional micro-optimization, BeginDragDropSource() does the same test.
    if (g.ActiveId == id && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropSource())
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F, &col_rgb, sizeof(float) * 3, ImGuiCond_Once);
        else
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F, &col_rgb, sizeof(float) * 4, ImGuiCond_Once);
        ColorButton(desc_id, col, flags);
        SameLine();
        TextEx("Color");
        EndDragDropSource();
    }

    // Tooltip
    if (!(flags & ImGuiColorEditFlags_NoTooltip) && hovered)
        ColorTooltip(desc_id, &col.x, flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf));

    return pressed;
}